

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sip_decomposer.cc
# Opt level: O1

HomomorphismResult *
gss::solve_sip_by_decomposition
          (HomomorphismResult *__return_storage_ptr__,InputGraph *pattern,InputGraph *target,
          HomomorphismParams *params)

{
  size_t *psVar1;
  _Rb_tree_header *p_Var2;
  _Base_ptr p_Var3;
  HomomorphismResult *pHVar4;
  undefined1 *puVar5;
  InputGraph *this;
  size_t __val;
  uint uVar6;
  bool bVar7;
  bool e;
  undefined1 uVar8;
  int iVar9;
  uint uVar10;
  _Base_ptr p_Var11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  _List_node_base *p_Var13;
  undefined8 uVar14;
  _Rb_tree_node_base *p_Var15;
  loooong *plVar16;
  data_type *pdVar17;
  undefined4 uVar18;
  _Rb_tree_header *p_Var19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  limb_type lVar21;
  size_t sVar22;
  ulong uVar23;
  limb_type lVar24;
  int iVar25;
  ulong uVar26;
  HomomorphismParams *pHVar27;
  pair<std::_Rb_tree_iterator<int>,_std::_Rb_tree_iterator<int>_> pVar28;
  set<int,_std::less<int>,_std::allocator<int>_> t_avail;
  VertexToVertexMapping sub_mapping;
  InputGraph reduced_pattern;
  number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
  denominator;
  vector<int,_std::allocator<int>_> original_to_reduced;
  vector<int,_std::allocator<int>_> reduced_to_original;
  loooong solution_multiplier;
  set<int,_std::less<int>,_std::allocator<int>_> isolated_pattern_vertices;
  number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
  cf;
  undefined1 local_218 [16];
  data_type local_208;
  _Base_ptr local_1f8;
  size_t local_1f0;
  HomomorphismResult *local_1e0;
  number_kind_integergcd_funct<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  local_1d1;
  HomomorphismParams *local_1d0;
  undefined1 local_1c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8 [2];
  InputGraph local_190;
  data_type local_188;
  undefined8 local_178;
  vector<int,_std::allocator<int>_> local_168;
  void *local_148;
  iterator iStack_140;
  int *local_138;
  data_type local_128;
  undefined4 local_118;
  undefined2 local_114;
  char local_112;
  data_type local_108;
  undefined4 local_f8;
  byte local_f4;
  undefined2 local_f3;
  InputGraph *local_e0;
  data_type local_d8;
  undefined4 local_c8;
  undefined2 local_c4;
  char local_c2;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_b8;
  data_type local_88;
  undefined4 local_78;
  undefined2 local_74;
  char local_72;
  uint local_68 [2];
  void *local_60;
  char local_53;
  char local_52;
  expression<boost::multiprecision::detail::function,_boost::multiprecision::detail::number_kind_integergcd_funct<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_void>
  local_48;
  
  local_b8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b8._M_impl.super__Rb_tree_header._M_header;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_e0 = target;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b8._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((((((params->induced == false) &&
         ((params->pattern_less_constraints).
          super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl._M_node.super__List_node_base._M_next ==
          (_List_node_base *)&params->pattern_less_constraints)) &&
        ((params->target_occur_less_constraints).
         super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl._M_node.super__List_node_base._M_next ==
         (_List_node_base *)&params->target_occur_less_constraints)) &&
       (((params->lackey)._M_t.
         super___uniq_ptr_impl<gss::innards::Lackey,_std::default_delete<gss::innards::Lackey>_>.
         _M_t.
         super__Tuple_impl<0UL,_gss::innards::Lackey_*,_std::default_delete<gss::innards::Lackey>_>.
         super__Head_base<0UL,_gss::innards::Lackey_*,_false>._M_head_impl == (Lackey *)0x0 &&
        (bVar7 = InputGraph::has_vertex_labels(pattern), !bVar7)))) &&
      ((params->count_solutions != true ||
       ((params->enumerate_callback).super__Function_base._M_manager == (_Manager_type)0x0)))) &&
     (bVar7 = InputGraph::directed(pattern), !bVar7)) {
    local_218._0_8_ = local_218._0_8_ & 0xffffffff00000000;
    iVar9 = InputGraph::size(pattern);
    if (0 < iVar9) {
      do {
        iVar9 = InputGraph::degree(pattern,local_218._0_4_);
        if (iVar9 == 0) {
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_emplace_unique<int&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &local_b8,(int *)local_218);
        }
        iVar25 = local_218._0_4_ + 1;
        local_218._0_4_ = iVar25;
        iVar9 = InputGraph::size(pattern);
      } while (iVar25 < iVar9);
    }
  }
  if (local_b8._M_impl.super__Rb_tree_header._M_node_count == 0) {
    solve_homomorphism_problem(__return_storage_ptr__,pattern,local_e0,params);
    goto LAB_00128ea1;
  }
  local_1d0 = params;
  iVar9 = InputGraph::size(pattern);
  iVar9 = iVar9 - (int)local_b8._M_impl.super__Rb_tree_header._M_node_count;
  bVar7 = InputGraph::has_vertex_labels(pattern);
  e = InputGraph::has_edge_labels(pattern);
  InputGraph::InputGraph(&local_190,iVar9,bVar7,e);
  local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  iVar9 = 0;
  local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_138 = (int *)0x0;
  local_148 = (void *)0x0;
  iStack_140._M_current = (int *)0x0;
  while( true ) {
    local_218._0_4_ = iVar9;
    iVar25 = InputGraph::size(pattern);
    if (iVar25 <= iVar9) break;
    p_Var2 = &local_b8._M_impl.super__Rb_tree_header;
    p_Var11 = &p_Var2->_M_header;
    for (p_Var3 = local_b8._M_impl.super__Rb_tree_header._M_header._M_parent;
        (_Rb_tree_header *)p_Var3 != (_Rb_tree_header *)0x0;
        p_Var3 = (&p_Var3->_M_left)[(int)*(size_t *)(p_Var3 + 1) < (int)local_218._0_4_]) {
      if ((int)local_218._0_4_ <= (int)*(size_t *)(p_Var3 + 1)) {
        p_Var11 = p_Var3;
      }
    }
    p_Var19 = p_Var2;
    if (((_Rb_tree_header *)p_Var11 != p_Var2) &&
       (p_Var19 = (_Rb_tree_header *)p_Var11,
       (int)local_218._0_4_ < (int)((_Rb_tree_header *)p_Var11)->_M_node_count)) {
      p_Var19 = p_Var2;
    }
    if (p_Var19 == p_Var2) {
      local_1c8._0_4_ = (undefined4)((ulong)((long)iStack_140._M_current - (long)local_148) >> 2);
      if (local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_168,
                   (iterator)
                   local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)local_1c8);
      }
      else {
        *local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_1c8._0_4_;
        local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      if (iStack_140._M_current == local_138) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_148,iStack_140,(int *)local_218);
      }
      else {
        *iStack_140._M_current = local_218._0_4_;
        iStack_140._M_current = iStack_140._M_current + 1;
      }
    }
    else {
      local_1c8._0_4_ = 0xffffffff;
      if (local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_168,
                   (iterator)
                   local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)local_1c8);
      }
      else {
        *local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = -1;
        local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
    }
    iVar9 = local_218._0_4_ + 1;
  }
  local_1e0 = __return_storage_ptr__;
  for (uVar26 = 0; pHVar4 = local_1e0, iVar9 = InputGraph::size(pattern), this = local_e0,
      (long)uVar26 < (long)iVar9; uVar26 = uVar26 + 1) {
    if ((ulong)((long)local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) <= uVar26) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar26)
      ;
    }
    iVar9 = local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar26];
    if (iVar9 != -1) {
      for (uVar23 = 0; iVar25 = InputGraph::size(pattern), (long)uVar23 < (long)iVar25;
          uVar23 = uVar23 + 1) {
        if ((ulong)((long)local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) <= uVar23) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar23);
        }
        iVar25 = local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar23];
        if ((iVar25 != -1) && (bVar7 = InputGraph::adjacent(pattern,(int)uVar26,(int)uVar23), bVar7)
           ) {
          InputGraph::add_directed_edge
                    (&local_190,iVar9,iVar25,(string_view)(ZEXT816(0x17f23d) << 0x40));
        }
      }
    }
  }
  solve_homomorphism_problem(pHVar4,&local_190,local_e0,local_1d0);
  __val = local_b8._M_impl.super__Rb_tree_header._M_node_count;
  uVar10 = 1;
  if (9 < local_b8._M_impl.super__Rb_tree_header._M_node_count) {
    sVar22 = local_b8._M_impl.super__Rb_tree_header._M_node_count;
    uVar6 = 4;
    do {
      uVar10 = uVar6;
      if (sVar22 < 100) {
        uVar10 = uVar10 - 2;
        goto LAB_00128648;
      }
      if (sVar22 < 1000) {
        uVar10 = uVar10 - 1;
        goto LAB_00128648;
      }
      if (sVar22 < 10000) goto LAB_00128648;
      bVar7 = 99999 < sVar22;
      sVar22 = sVar22 / 10000;
      uVar6 = uVar10 + 4;
    } while (bVar7);
    uVar10 = uVar10 + 1;
  }
LAB_00128648:
  local_1c8._0_8_ = local_1b8;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
             (ulong)uVar10,'\0');
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_1c8._0_8_,local_1c8._8_4_,__val);
  pbVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1c8,0,0,"isolated_pattern_vertices = ",0x1c);
  pHVar27 = local_1d0;
  local_218._0_8_ = (pbVar12->_M_dataplus)._M_p;
  paVar20 = &pbVar12->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._0_8_ == paVar20) {
    local_208.la[0] = paVar20->_M_allocated_capacity;
    local_208.ld.data = (limb_pointer)*(long *)((long)&pbVar12->field_2 + 8);
    local_218._0_8_ = &local_208;
  }
  else {
    local_208.la[0] = paVar20->_M_allocated_capacity;
  }
  local_218._8_8_ = pbVar12->_M_string_length;
  (pbVar12->_M_dataplus)._M_p = (pointer)paVar20;
  pbVar12->_M_string_length = 0;
  (pbVar12->field_2)._M_local_buf[0] = '\0';
  p_Var13 = (_List_node_base *)operator_new(0x30);
  p_Var13[1]._M_next = p_Var13 + 2;
  if ((data_type *)local_218._0_8_ == &local_208) {
    p_Var13[2]._M_next = (_List_node_base *)local_208.la[0];
    p_Var13[2]._M_prev = (_List_node_base *)local_208.ld.data;
  }
  else {
    p_Var13[1]._M_next = (_List_node_base *)local_218._0_8_;
    p_Var13[2]._M_next = (_List_node_base *)local_208.la[0];
  }
  p_Var13[1]._M_prev = (_List_node_base *)local_218._8_8_;
  local_218._8_8_ = (data_type *)0x0;
  local_208.la[0] = local_208.la[0] & 0xffffffffffffff00;
  local_218._0_8_ = &local_208;
  std::__detail::_List_node_base::_M_hook(p_Var13);
  psVar1 = &(local_1e0->extra_stats).
            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if ((data_type *)local_218._0_8_ != &local_208) {
    operator_delete((void *)local_218._0_8_,(ulong)(local_208.la[0] + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._0_8_ != local_1b8) {
    operator_delete((void *)local_1c8._0_8_,
                    CONCAT17(local_1b8[0]._M_local_buf[7],
                             CONCAT16(local_1b8[0]._M_local_buf[6],
                                      CONCAT15(local_1b8[0]._M_local_buf[5],
                                               CONCAT14(local_1b8[0]._M_local_buf[4],
                                                        (undefined4)
                                                        local_1b8[0]._M_allocated_capacity)))) + 1);
  }
  __return_storage_ptr__ = local_1e0;
  if ((local_1e0->mapping)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_208.ld.data = (limb_pointer)(local_218 + 8);
    local_218._8_8_ = local_218._8_8_ & 0xffffffff00000000;
    iVar9 = 0;
    local_208.la[0] = 0;
    local_1f0 = 0;
    local_1f8 = (_Base_ptr)local_208.ld.data;
    while( true ) {
      local_1c8._0_4_ = iVar9;
      iVar25 = InputGraph::size(this);
      pHVar4 = local_1e0;
      if (iVar25 <= iVar9) break;
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_emplace_unique<int&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 local_218,(int *)local_1c8);
      iVar9 = local_1c8._0_4_ + 1;
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                *)local_1c8,
               (_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                *)local_1e0);
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::clear((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
             *)pHVar4);
    __return_storage_ptr__ = local_1e0;
    uVar14 = local_1b8[0]._8_8_;
    p_Var15 = local_b8._M_impl.super__Rb_tree_header._M_header._M_left;
    while (local_1e0 = __return_storage_ptr__,
          local_b8._M_impl.super__Rb_tree_header._M_header._M_left = p_Var15,
          (_Rb_tree_node_base *)uVar14 != (_Rb_tree_node_base *)(local_1c8 + 8)) {
      pVar28 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
               equal_range((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                            *)local_218,
                           (key_type *)&((_Rb_tree_node_base *)(uVar14 + 0x20))->field_0x4);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
      _M_erase_aux((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                   local_218,(_Base_ptr)pVar28.first._M_node,(_Base_ptr)pVar28.second._M_node);
      if ((ulong)((long)iStack_140._M_current - (long)local_148 >> 2) <=
          (ulong)(long)(int)((_Rb_tree_node_base *)(uVar14 + 0x20))->_M_color) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      std::
      _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
      ::_M_emplace_unique<int&,int&>
                ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                  *)local_1e0,
                 (int *)((long)local_148 +
                        (long)(int)((_Rb_tree_node_base *)(uVar14 + 0x20))->_M_color * 4),
                 (int *)&((_Rb_tree_node_base *)(uVar14 + 0x20))->field_0x4);
      uVar14 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar14);
      __return_storage_ptr__ = local_1e0;
      p_Var15 = local_b8._M_impl.super__Rb_tree_header._M_header._M_left;
    }
    if ((_Rb_tree_header *)p_Var15 != &local_b8._M_impl.super__Rb_tree_header) {
      do {
        std::
        _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
        ::_M_emplace_unique<int_const&,int_const&>
                  ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                    *)__return_storage_ptr__,(int *)(p_Var15 + 1),(int *)(local_208.la[1] + 0x20));
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        erase_abi_cxx11_((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *
                         )local_218,(const_iterator)local_208.ld.data);
        p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15);
      } while ((_Rb_tree_header *)p_Var15 != &local_b8._M_impl.super__Rb_tree_header);
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                 *)local_1c8);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_218);
    pHVar27 = local_1d0;
  }
  if ((pHVar27->count_solutions == true) &&
     ((__return_storage_ptr__->solution_count).m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_sign == false)) {
    local_1d0 = (HomomorphismParams *)&__return_storage_ptr__->solution_count;
    if ((__return_storage_ptr__->solution_count).m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_limbs < 2) {
      plVar16 = (loooong *)local_1d0;
      if ((__return_storage_ptr__->solution_count).m_backend.
          super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          .m_internal == false) {
        plVar16 = (loooong *)
                  (__return_storage_ptr__->solution_count).m_backend.
                  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  .m_data.la[1];
      }
      if ((plVar16->m_backend).
          super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          .m_data.la[0] == 0) goto LAB_00128e5a;
    }
    iVar9 = InputGraph::size(this);
    iVar25 = InputGraph::size(&local_190);
    iVar9 = iVar9 - iVar25;
    lVar24 = (limb_type)iVar9;
    local_108.la[0] = 0;
    local_f8 = 0;
    local_f4 = (byte)(iVar9 >> 0x1f) >> 7;
    local_f3 = 1;
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              *)&local_108.ld,1,1);
    lVar21 = -lVar24;
    if (0 < (long)lVar24) {
      lVar21 = lVar24;
    }
    if (-1 < iVar9) {
      lVar21 = lVar24;
    }
    uVar14 = &local_108;
    if ((char)local_f3 == '\0') {
      uVar14 = local_108.ld.data;
    }
    ((data_type *)&((limb_data *)uVar14)->capacity)->la[0] = lVar21;
    local_d8.la[0] = local_b8._M_impl.super__Rb_tree_header._M_node_count;
    local_c8 = 1;
    local_c4 = 0x100;
    local_c2 = '\0';
    local_128.la[0] = 1;
    local_118 = 1;
    local_114 = 0x100;
    local_112 = '\0';
    local_218._0_8_ = (type)0x1;
    local_208.la[0]._0_7_ = 0x10000000001;
    while( true ) {
      uVar8 = local_208.la[0]._4_1_;
      if (local_208.la[0]._4_1_ == (char)local_c4) {
        iVar25 = boost::multiprecision::backends::
                 cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                 ::
                 compare_unsigned<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                           ((cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                             *)local_218,
                            (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                             *)&local_d8.ld);
        iVar9 = -iVar25;
        if ((bool)local_208.la[0]._4_1_ == false) {
          iVar9 = iVar25;
        }
        uVar8 = iVar9 < 1;
      }
      if (uVar8 == '\0') break;
      local_188.la[0] = (limb_type)&local_108;
      local_188.ld.data = (limb_pointer)&local_d8;
      local_178 = local_218;
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
      ::
      number<boost::multiprecision::detail::plus,boost::multiprecision::detail::expression<boost::multiprecision::detail::subtract_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,void,void>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,void,void>
                ((number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
                  *)local_1c8,
                 (expression<boost::multiprecision::detail::plus,_boost::multiprecision::detail::expression<boost::multiprecision::detail::subtract_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                  *)&local_188.ld,(type *)0x0);
      puVar5 = local_178;
      local_188.la[0] = 0;
      uVar18 = 0;
      if ((bool)local_208.la[0]._6_1_ != false) {
        uVar18 = local_208.ld.capacity;
      }
      local_178._0_5_ = CONCAT14(local_208.la[0]._4_1_,uVar18);
      local_178._7_1_ = SUB81(puVar5,7);
      local_178 = (undefined1 *)
                  (CONCAT17(local_178._7_1_,
                            CONCAT16(local_208.la[0]._6_1_,
                                     CONCAT15(local_208.la[0]._6_1_,(undefined5)local_178))) ^
                  0x10000000000);
      if ((bool)local_208.la[0]._6_1_ == true) {
        local_188.la[0] = local_218._0_8_;
        local_188.ld.data = (limb_pointer)local_218._8_8_;
      }
      else {
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&local_188.ld,local_208.ld.capacity,local_208.ld.capacity);
        uVar14 = &local_188;
        if (local_178._5_1_ == '\0') {
          uVar14 = local_188.ld.data;
        }
        pdVar17 = (data_type *)local_218;
        if ((bool)local_208.la[0]._5_1_ == false) {
          pdVar17 = (data_type *)local_218._8_8_;
        }
        memcpy((void *)uVar14,pdVar17,(local_208.la[0] & 0xffffffff) << 3);
      }
      local_48.arg1 = &local_1d1;
      local_48.arg2 = (type)&local_128;
      local_48.arg3 = (type)&local_188;
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
      ::
      number<boost::multiprecision::detail::function,boost::multiprecision::detail::number_kind_integergcd_funct<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,void>
                ((number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
                  *)local_68,&local_48,(type *)0x0);
      boost::multiprecision::backends::
      eval_divide<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>,0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                ((cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)&local_128.ld,
                 (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)local_68);
      boost::multiprecision::backends::
      eval_divide<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>,0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                ((cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)&local_188.ld,
                 (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)local_68);
      boost::multiprecision::backends::
      eval_divide<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>,0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                ((cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)local_1c8,
                 (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)&local_188.ld);
      boost::multiprecision::backends::
      eval_multiply<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>,0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>,0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                ((cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)&local_128.ld,
                 (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)&local_128,
                 (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)local_1c8);
      if ((local_53 == '\0') && (local_52 == '\0')) {
        operator_delete(local_60,(ulong)local_68[0] << 3);
      }
      if ((local_178._5_1_ == '\0') && (local_178._6_1_ == '\0')) {
        operator_delete(local_188.ld.data,(local_188.la[0] & 0xffffffff) << 3);
      }
      if ((local_1b8[0]._M_local_buf[5] == '\0') && (local_1b8[0]._M_local_buf[6] == '\0')) {
        operator_delete((void *)CONCAT44(local_1c8._12_4_,local_1c8._8_4_),
                        (local_1c8._0_8_ & 0xffffffff) << 3);
      }
      local_1c8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x1;
      uVar8 = local_208.la[0]._5_1_;
      pdVar17 = (data_type *)local_218;
      if ((bool)local_208.la[0]._5_1_ == false) {
        pdVar17 = (data_type *)local_218._8_8_;
      }
      lVar21 = ((data_type *)&(pdVar17->ld).capacity)->la[0];
      if ((bool)local_208.la[0]._4_1_ == false) {
        if (lVar21 == 0xffffffffffffffff) goto LAB_00128c12;
        ((data_type *)&(pdVar17->ld).capacity)->la[0] = lVar21 + 1;
      }
      else if (lVar21 == 0) {
LAB_00128c12:
        boost::multiprecision::backends::
        eval_add<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                  ((cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                    *)local_218,(limb_type *)local_1c8);
      }
      else {
        ((data_type *)&(pdVar17->ld).capacity)->la[0] = lVar21 - 1;
        pdVar17 = (data_type *)local_218;
        if ((bool)uVar8 == false) {
          pdVar17 = (data_type *)local_218._8_8_;
        }
        if (((data_type *)&(pdVar17->ld).capacity)->la[0] == 0) {
          local_208.la[0]._4_1_ = 0;
        }
      }
    }
    if (((bool)local_208.la[0]._5_1_ == false) && ((bool)local_208.la[0]._6_1_ == false)) {
      operator_delete((void *)local_218._8_8_,(local_218._0_8_ & 0xffffffff) << 3);
    }
    if ((local_c4._1_1_ == '\0') && (local_c2 == '\0')) {
      operator_delete(local_d8.ld.data,(local_d8.la[0] & 0xffffffff) << 3);
    }
    if (((char)local_f3 == '\0') && (local_f3._1_1_ == '\0')) {
      operator_delete(local_108.ld.data,(local_108.la[0] & 0xffffffff) << 3);
    }
    local_88.la[0] = local_b8._M_impl.super__Rb_tree_header._M_node_count;
    local_78 = 1;
    local_74 = 0x100;
    local_72 = '\0';
    local_1c8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x1;
    local_1b8[0]._M_allocated_capacity._0_4_ = 1;
    local_1b8[0]._M_local_buf[4] = '\0';
    local_1b8[0]._M_local_buf[5] = '\x01';
    local_1b8[0]._M_local_buf[6] = '\0';
    local_218._0_8_ = (type)0x2;
    local_208.la[0]._0_7_ = 0x10000000001;
    while( true ) {
      uVar8 = local_208.la[0]._4_1_;
      if (local_208.la[0]._4_1_ == (char)local_74) {
        iVar25 = boost::multiprecision::backends::
                 cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                 ::
                 compare_unsigned<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                           ((cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                             *)local_218,
                            (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                             *)&local_88.ld);
        iVar9 = -iVar25;
        if ((bool)local_208.la[0]._4_1_ == false) {
          iVar9 = iVar25;
        }
        uVar8 = iVar9 < 1;
      }
      if (uVar8 == '\0') break;
      boost::multiprecision::backends::
      eval_multiply<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>,0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>,0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                ((cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)&((data_type *)local_1c8)->ld,
                 (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)local_1c8,
                 (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                  *)local_218);
      local_188.la[0] = 1;
      uVar8 = local_208.la[0]._5_1_;
      pdVar17 = (data_type *)local_218;
      if ((bool)local_208.la[0]._5_1_ == false) {
        pdVar17 = (data_type *)local_218._8_8_;
      }
      lVar21 = ((data_type *)&(pdVar17->ld).capacity)->la[0];
      if ((bool)local_208.la[0]._4_1_ == false) {
        if (lVar21 == 0xffffffffffffffff) goto LAB_00128d9a;
        ((data_type *)&(pdVar17->ld).capacity)->la[0] = lVar21 + 1;
      }
      else if (lVar21 == 0) {
LAB_00128d9a:
        boost::multiprecision::backends::
        eval_add<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                  ((cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                    *)local_218,local_188.la);
      }
      else {
        ((data_type *)&(pdVar17->ld).capacity)->la[0] = lVar21 - 1;
        pdVar17 = (data_type *)local_218;
        if ((bool)uVar8 == false) {
          pdVar17 = (data_type *)local_218._8_8_;
        }
        if (((data_type *)&(pdVar17->ld).capacity)->la[0] == 0) {
          local_208.la[0]._4_1_ = 0;
        }
      }
    }
    if (((bool)local_208.la[0]._5_1_ == false) && ((bool)local_208.la[0]._6_1_ == false)) {
      operator_delete((void *)local_218._8_8_,(local_218._0_8_ & 0xffffffff) << 3);
    }
    if ((local_74._1_1_ == '\0') && (local_72 == '\0')) {
      operator_delete(local_88.ld.data,(local_88.la[0] & 0xffffffff) << 3);
    }
    local_218._0_8_ = &local_128;
    local_218._8_8_ = (data_type *)local_1c8;
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
    ::operator*=((number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
                  *)local_1d0,
                 (expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                  *)local_218);
    __return_storage_ptr__ = local_1e0;
    if ((local_1b8[0]._M_local_buf[5] == '\0') && (local_1b8[0]._M_local_buf[6] == '\0')) {
      operator_delete((void *)CONCAT44(local_1c8._12_4_,local_1c8._8_4_),
                      (local_1c8._0_8_ & 0xffffffff) << 3);
    }
    if ((local_114._1_1_ == '\0') && (local_112 == '\0')) {
      operator_delete(local_128.ld.data,(local_128.la[0] & 0xffffffff) << 3);
    }
  }
LAB_00128e5a:
  if (local_148 != (void *)0x0) {
    operator_delete(local_148,(long)local_138 - (long)local_148);
  }
  if (local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  InputGraph::~InputGraph(&local_190);
LAB_00128ea1:
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_b8);
  return __return_storage_ptr__;
}

Assistant:

auto gss::solve_sip_by_decomposition(const InputGraph & pattern, const InputGraph & target,
    const HomomorphismParams & params) -> HomomorphismResult
{
    set<int> isolated_pattern_vertices;
    find_removable_isolated_pattern_vertices(pattern, params, isolated_pattern_vertices);

    if (! isolated_pattern_vertices.empty()) {
        InputGraph reduced_pattern(pattern.size() - isolated_pattern_vertices.size(), pattern.has_vertex_labels(),
            pattern.has_edge_labels());

        vector<int> original_to_reduced, reduced_to_original;

        for (int i = 0; i < pattern.size(); ++i) {
            if (isolated_pattern_vertices.count(i))
                original_to_reduced.push_back(-1);
            else {
                original_to_reduced.push_back(reduced_to_original.size());
                reduced_to_original.push_back(i);
            }
        }

        for (int i = 0; i < pattern.size(); ++i) {
            auto r_i = original_to_reduced.at(i);
            if (r_i == -1)
                continue;

            for (int j = 0; j < pattern.size(); ++j) {
                auto r_j = original_to_reduced.at(j);
                if (r_j == -1)
                    continue;

                if (pattern.adjacent(i, j))
                    reduced_pattern.add_directed_edge(r_i, r_j, "");
            }
        }
        auto result = solve_homomorphism_problem(reduced_pattern, target, params);

        result.extra_stats.emplace_back("isolated_pattern_vertices = " + to_string(isolated_pattern_vertices.size()));

        // fix up the result to be in the non-decomposed form
        if (! result.mapping.empty()) {
            // need to re-add isolated vertices, arbitrarily. what's available?
            set<int> t_avail;
            for (int i = 0; i < target.size(); ++i)
                t_avail.emplace(i);

            // convert back to original indices, and remove used vertices
            auto sub_mapping = result.mapping;
            result.mapping.clear();
            for (auto & [p, t] : sub_mapping) {
                t_avail.erase(t);
                result.mapping.emplace(reduced_to_original.at(p), t);
            }

            // add in isolated vertices
            for (auto & p : isolated_pattern_vertices) {
                result.mapping.emplace(p, *t_avail.begin());
                t_avail.erase(t_avail.begin());
            }
        }

        // fix up the solution count
        if (params.count_solutions && result.solution_count > 0) {
            loooong unmapped_target_vertices = target.size() - reduced_pattern.size();
            loooong solution_multiplier = n_choose_k<loooong>(unmapped_target_vertices, isolated_pattern_vertices.size());
            loooong isolated_symmetry_multiplier = factorial<loooong>(isolated_pattern_vertices.size());
            result.solution_count *= solution_multiplier * isolated_symmetry_multiplier;
        }

        return result;
    }
    else
        return solve_homomorphism_problem(pattern, target, params);
}